

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  byte bVar1;
  runtime_error *this;
  char local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [48];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  int *local_18;
  int *_dest_local;
  string *_source_local;
  
  local_18 = _dest;
  _dest_local = (int *)_source;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,(string *)_dest_local);
  std::istream::operator>>(local_1a0,local_18);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::stringstream::~stringstream(local_1a0);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Unable to convert ");
  std::operator+(local_1d0,local_1f0);
  std::runtime_error::runtime_error(this,(string *)local_1d0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }